

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O2

void button_menu(void)

{
  byte bVar1;
  int iVar2;
  button *this;
  char *pcVar3;
  bool bVar4;
  ulong in_RAX;
  ostream *poVar5;
  char c;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  do {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"*** button menu ***");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"(1) back");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"(2) left");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"(3) right");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"(4) up");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"(5) down");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"(6) enter");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"(b)ack");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<(poVar5,"Choice: ");
    std::operator>>((istream *)&std::cin,(char *)((long)&uStack_38 + 7));
    bVar1 = uStack_38._7_1_ - 0x31;
    if (bVar1 < 6) {
      iVar2 = *(int *)(&DAT_0011d1a8 + (ulong)bVar1 * 4);
      this = (button *)(&PTR_back_00125c98)[bVar1];
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<(poVar5,&DAT_0011d1a8 + iVar2);
      bVar4 = ev3dev::button::pressed(this);
      pcVar3 = "(4) up";
      if (bVar4) {
        pcVar3 = "(5) down";
      }
      poVar5 = std::operator<<(poVar5,pcVar3 + 4);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  } while (uStack_38._7_1_ != 'b');
  return;
}

Assistant:

void button_menu()
{
  char c = 0;
  do
  {
    cout << endl
         << "*** button menu ***" << endl
         << endl
         << "(1) back"  << endl
         << "(2) left"  << endl
         << "(3) right" << endl
         << "(4) up"    << endl
         << "(5) down"  << endl
         << "(6) enter" << endl
         << endl
         << "(b)ack"    << endl
         << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case '1':
      cout << endl << "back button is " << (button::back.pressed() ? "down" : "up") << endl;
      break;
    case '2':
      cout << endl << "left button is " << (button::left.pressed() ? "down" : "up") << endl;
      break;
    case '3':
      cout << endl << "right button is " << (button::right.pressed() ? "down" : "up") << endl;
      break;
    case '4':
      cout << endl << "up button is " << (button::up.pressed() ? "down" : "up") << endl;
      break;
    case '5':
      cout << endl << "down button is " << (button::down.pressed() ? "down" : "up") << endl;
      break;
    case '6':
      cout << endl << "enter button is " << (button::enter.pressed() ? "down" : "up") << endl;
      break;
    }
  }
  while (c != 'b');
}